

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalNinjaGenerator::WriteTargetCleanAdditional(cmGlobalNinjaGenerator *this,ostream *os)

{
  string *this_00;
  bool bVar1;
  byte bVar2;
  reference ppcVar3;
  string *psVar4;
  reference path;
  ostream *poVar5;
  cmMakefile *this_01;
  cmOutputConverter *this_02;
  type os_00;
  char *__s;
  allocator<char> local_631;
  string local_630;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  undefined1 local_5c8 [8];
  cmNinjaBuild build;
  string local_4a0;
  string local_480;
  allocator<char> local_459;
  string local_458;
  undefined1 local_438 [8];
  cmNinjaRule rule;
  string *acf;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmGeneratedFileStream fout;
  undefined1 local_80 [8];
  string cleanScriptAbs;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string cleanScriptRel;
  cmLocalGenerator *lgr;
  ostream *os_local;
  cmGlobalNinjaGenerator *this_local;
  
  ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::at
                      (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                        LocalGenerators,0);
  cleanScriptRel.field_2._8_8_ = *ppcVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"CMakeFiles/clean_additional.cmake",&local_49);
  std::allocator<char>::~allocator(&local_49);
  psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)cleanScriptRel.field_2._8_8_);
  std::__cxx11::string::string((string *)local_80,(string *)psVar4);
  std::__cxx11::string::operator+=((string *)local_80,'/');
  std::__cxx11::string::operator+=((string *)local_80,(string *)local_48);
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->AdditionalCleanFiles);
  if (bVar1) {
    cmsys::SystemTools::RemoveFile((string *)local_80);
    this_local._7_1_ = 0;
    fout._580_4_ = 1;
  }
  else {
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&__range1,(string *)local_80,false,None);
    bVar2 = std::ios::operator!((ios *)((long)&__range1 +
                                       (long)__range1[-1]._M_t._M_impl.super__Rb_tree_header.
                                             _M_header._M_left));
    if ((bVar2 & 1) == 0) {
      std::operator<<((ostream *)&__range1,"# Additional clean files\n\n");
      std::operator<<((ostream *)&__range1,"file(REMOVE_RECURSE\n");
      __end1 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->AdditionalCleanFiles);
      acf = (string *)
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->AdditionalCleanFiles);
      while( true ) {
        bVar1 = std::operator!=(&__end1,(_Self *)&acf);
        if (!bVar1) break;
        path = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
        poVar5 = std::operator<<((ostream *)&__range1,"  ");
        psVar4 = ConvertToNinjaPath(this,path);
        cmOutputConverter::EscapeForCMake((string *)&rule.Generator,psVar4);
        poVar5 = std::operator<<(poVar5,(string *)&rule.Generator);
        std::operator<<(poVar5,'\n');
        std::__cxx11::string::~string((string *)&rule.Generator);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end1);
      }
      std::operator<<((ostream *)&__range1,")\n");
      fout._580_4_ = 0;
    }
    else {
      this_local._7_1_ = 0;
      fout._580_4_ = 1;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&__range1);
    if (fout._580_4_ == 0) {
      this_01 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)cleanScriptRel.field_2._8_8_);
      cmMakefile::AddCMakeOutputFile(this_01,(string *)local_80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_458,"CLEAN_ADDITIONAL",&local_459);
      cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_438,&local_458);
      std::__cxx11::string::~string((string *)&local_458);
      std::allocator<char>::~allocator(&local_459);
      CMakeCmd_abi_cxx11_(&local_480,this);
      this_00 = (string *)(rule.Name.field_2._M_local_buf + 8);
      std::__cxx11::string::operator=(this_00,(string *)&local_480);
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::operator+=(this_00," -P ");
      this_02 = (cmOutputConverter *)(cleanScriptRel.field_2._8_8_ + 8);
      NinjaOutputPath((string *)((long)&build.RspFile.field_2 + 8),this,(string *)local_48);
      cmOutputConverter::ConvertToOutputFormat
                (&local_4a0,this_02,(string *)((long)&build.RspFile.field_2 + 8),SHELL);
      std::__cxx11::string::operator+=
                ((string *)(rule.Name.field_2._M_local_buf + 8),(string *)&local_4a0);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::__cxx11::string::~string((string *)(build.RspFile.field_2._M_local_buf + 8));
      std::__cxx11::string::operator=
                ((string *)(rule.Command.field_2._M_local_buf + 8),"Cleaning additional files...");
      std::__cxx11::string::operator=
                ((string *)(rule.Description.field_2._M_local_buf + 8),
                 "Rule for cleaning additional files.");
      os_00 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
              operator*(&this->RulesFileStream);
      WriteRule((ostream *)os_00,(cmNinjaRule *)local_438);
      cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_438);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5e8,"CLEAN_ADDITIONAL",&local_5e9);
      cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_5c8,&local_5e8);
      std::__cxx11::string::~string((string *)&local_5e8);
      std::allocator<char>::~allocator(&local_5e9);
      std::__cxx11::string::operator=((string *)local_5c8,"Clean additional files.");
      __s = GetAdditionalCleanTargetName(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,__s,&local_631);
      NinjaOutputPath(&local_610,this,&local_630);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&build.Rule.field_2 + 8),&local_610);
      std::__cxx11::string::~string((string *)&local_610);
      std::__cxx11::string::~string((string *)&local_630);
      std::allocator<char>::~allocator(&local_631);
      WriteBuild(this,os,(cmNinjaBuild *)local_5c8,0,(bool *)0x0);
      cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_5c8);
      this_local._7_1_ = 1;
      fout._580_4_ = 1;
    }
  }
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_48);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalNinjaGenerator::WriteTargetCleanAdditional(std::ostream& os)
{
  cmLocalGenerator* lgr = this->LocalGenerators.at(0);
  std::string cleanScriptRel = "CMakeFiles/clean_additional.cmake";
  std::string cleanScriptAbs = lgr->GetBinaryDirectory();
  cleanScriptAbs += '/';
  cleanScriptAbs += cleanScriptRel;

  // Check if there are additional files to clean
  if (this->AdditionalCleanFiles.empty()) {
    // Remove cmake clean script file if it exists
    cmSystemTools::RemoveFile(cleanScriptAbs);
    return false;
  }

  // Write cmake clean script file
  {
    cmGeneratedFileStream fout(cleanScriptAbs);
    if (!fout) {
      return false;
    }
    fout << "# Additional clean files\n\n";
    fout << "file(REMOVE_RECURSE\n";
    for (std::string const& acf : this->AdditionalCleanFiles) {
      fout << "  "
           << cmOutputConverter::EscapeForCMake(ConvertToNinjaPath(acf))
           << '\n';
    }
    fout << ")\n";
  }
  // Register clean script file
  lgr->GetMakefile()->AddCMakeOutputFile(cleanScriptAbs);

  // Write rule
  {
    cmNinjaRule rule("CLEAN_ADDITIONAL");
    rule.Command = CMakeCmd();
    rule.Command += " -P ";
    rule.Command += lgr->ConvertToOutputFormat(
      this->NinjaOutputPath(cleanScriptRel), cmOutputConverter::SHELL);
    rule.Description = "Cleaning additional files...";
    rule.Comment = "Rule for cleaning additional files.";
    WriteRule(*this->RulesFileStream, rule);
  }

  // Write build
  {
    cmNinjaBuild build("CLEAN_ADDITIONAL");
    build.Comment = "Clean additional files.";
    build.Outputs.push_back(
      this->NinjaOutputPath(this->GetAdditionalCleanTargetName()));
    WriteBuild(os, build);
  }
  // Return success
  return true;
}